

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O3

bool isItAFunction<KarpRabinHash<unsigned_long_long,unsigned_char>>(uint L)

{
  byte bVar1;
  uint32 uVar2;
  unsigned_long_long uVar3;
  ostream *poVar4;
  ulong uVar5;
  byte *pbVar6;
  ulong uVar7;
  byte bVar8;
  uint j;
  byte *pbVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  _Map_pointer ppuVar13;
  bool bVar14;
  uchar c;
  deque<unsigned_char,_std::allocator<unsigned_char>_> s;
  KarpRabinHash<unsigned_long_long,_unsigned_char> hf;
  mersenneRNG generator;
  byte local_1c41;
  uint32 local_1c40;
  _Deque_base<unsigned_char,_std::allocator<unsigned_char>_> local_1c38;
  KarpRabinHash<unsigned_long_long,_unsigned_char> local_1be8;
  MTRand local_13c8;
  int local_38;
  
  MTRand::seed(&local_13c8);
  local_38 = 5;
  iVar11 = 3;
  KarpRabinHash<unsigned_long_long,_unsigned_char>::KarpRabinHash(&local_1be8,3,L);
  local_1c38._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1c38._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1c38._M_impl.super__Deque_impl_data._M_finish._M_cur = (byte *)0x0;
  local_1c38._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1c38._M_impl.super__Deque_impl_data._M_start._M_last = (byte *)0x0;
  local_1c38._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur = (byte *)0x0;
  local_1c38._M_impl.super__Deque_impl_data._M_start._M_first = (byte *)0x0;
  local_1c38._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1c38._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_initialize_map(&local_1c38,0);
  do {
    local_1c40 = (uint32)local_38;
    uVar2 = MTRand::randInt(&local_13c8,&local_1c40);
    local_1c41 = (char)uVar2 + 0x41;
    if (local_1c38._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_1c38._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_char,std::allocator<unsigned_char>>::
      _M_push_back_aux<unsigned_char_const&>
                ((deque<unsigned_char,std::allocator<unsigned_char>> *)&local_1c38,&local_1c41);
    }
    else {
      *local_1c38._M_impl.super__Deque_impl_data._M_finish._M_cur = local_1c41;
      local_1c38._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_1c38._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    local_1be8.hashvalue =
         local_1be8.hashvalue * 0x25 + local_1be8.hasher.hashvalues[local_1c41] &
         local_1be8.HASHMASK;
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  bVar14 = false;
  uVar12 = 0;
  while( true ) {
    bVar1 = *local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_1c38._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_1c38._M_impl.super__Deque_impl_data._M_start._M_first);
      local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_1c38._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_1c38._M_impl.super__Deque_impl_data._M_start._M_last =
           local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur + 0x200;
      local_1c38._M_impl.super__Deque_impl_data._M_start._M_first =
           local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_1c38._M_impl.super__Deque_impl_data._M_start._M_node =
           local_1c38._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    local_1c40 = (uint32)local_38;
    uVar2 = MTRand::randInt(&local_13c8,&local_1c40);
    bVar8 = (char)uVar2 + 0x41;
    local_1c40 = CONCAT71(local_1c40._1_7_,bVar8);
    if (local_1c38._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_1c38._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::_M_push_back_aux<unsigned_char>
                ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c38,
                 (uchar *)&local_1c40);
    }
    else {
      *local_1c38._M_impl.super__Deque_impl_data._M_finish._M_cur = bVar8;
      local_1c38._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_1c38._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    local_1be8.hashvalue =
         (local_1be8.hashvalue * 0x25 + local_1be8.hasher.hashvalues[bVar8]) -
         local_1be8.hasher.hashvalues[bVar1] * local_1be8.BtoN & local_1be8.HASHMASK;
    uVar3 = KarpRabinHash<unsigned_long_long,unsigned_char>::
            hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                      ((KarpRabinHash<unsigned_long_long,unsigned_char> *)&local_1be8,
                       (deque<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c38);
    if (uVar3 != local_1be8.hashvalue) break;
    bVar14 = 0x1869e < uVar12;
    uVar12 = uVar12 + 1;
    if (uVar12 == 100000) {
      bVar14 = true;
LAB_00103d9b:
      std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base(&local_1c38);
      return bVar14;
    }
  }
  pbVar9 = local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppuVar13 = local_1c38._M_impl.super__Deque_impl_data._M_start._M_node;
  pbVar6 = local_1c38._M_impl.super__Deque_impl_data._M_start._M_last;
  if (local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_1c38._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    do {
      local_1c40 = CONCAT71(local_1c40._1_7_,*pbVar9);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_1c40,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      pbVar9 = pbVar9 + 1;
      if (pbVar9 == pbVar6) {
        pbVar9 = ppuVar13[1];
        ppuVar13 = ppuVar13 + 1;
        pbVar6 = pbVar9 + 0x200;
      }
    } while (pbVar9 != local_1c38._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"bug",3);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  uVar5 = (long)local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur -
          (long)local_1c38._M_impl.super__Deque_impl_data._M_start._M_first;
  if ((long)uVar5 < 0) {
    uVar7 = (long)uVar5 >> 9;
LAB_00103b0c:
    pbVar6 = local_1c38._M_impl.super__Deque_impl_data._M_start._M_node[uVar7] +
             uVar5 + uVar7 * -0x200;
  }
  else {
    pbVar6 = local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (0x1ff < uVar5) {
      uVar7 = uVar5 >> 9;
      goto LAB_00103b0c;
    }
  }
  local_1c40._0_1_ = *pbVar6;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)&local_1c40,1);
  pbVar6 = local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur +
           (1 - (long)local_1c38._M_impl.super__Deque_impl_data._M_start._M_first);
  if ((long)local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur -
      (long)local_1c38._M_impl.super__Deque_impl_data._M_start._M_first < -1) {
    uVar5 = (long)pbVar6 >> 9;
LAB_00103b7c:
    pbVar6 = local_1c38._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] +
             (long)(pbVar6 + uVar5 * -0x200);
  }
  else {
    if ((byte *)0x1ff < pbVar6) {
      uVar5 = (ulong)pbVar6 >> 9;
      goto LAB_00103b7c;
    }
    pbVar6 = local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
  }
  local_1c40._0_1_ = *pbVar6;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_1c40,1);
  pbVar6 = local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur +
           (2 - (long)local_1c38._M_impl.super__Deque_impl_data._M_start._M_first);
  if ((long)local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur -
      (long)local_1c38._M_impl.super__Deque_impl_data._M_start._M_first < -2) {
    uVar5 = (long)pbVar6 >> 9;
LAB_00103be7:
    pbVar6 = local_1c38._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] +
             (long)(pbVar6 + uVar5 * -0x200);
  }
  else {
    if ((byte *)0x1ff < pbVar6) {
      uVar5 = (ulong)pbVar6 >> 9;
      goto LAB_00103be7;
    }
    pbVar6 = local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur + 2;
  }
  local_1c40 = CONCAT71(local_1c40._1_7_,*pbVar6);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_1c40,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," was hashed to ",0xf);
  poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," when true hash value is ",0x19);
  KarpRabinHash<unsigned_long_long,unsigned_char>::
  hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
            ((KarpRabinHash<unsigned_long_long,unsigned_char> *)&local_1be8,
             (deque<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c38);
  poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  lVar10 = 0;
  do {
    pbVar6 = local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur +
             (lVar10 - (long)local_1c38._M_impl.super__Deque_impl_data._M_start._M_first);
    if ((long)pbVar6 < 0) {
      uVar5 = (long)pbVar6 >> 9;
LAB_00103cd4:
      pbVar9 = local_1c38._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] +
               (long)(local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur +
                     (uVar5 * -0x200 -
                     (long)local_1c38._M_impl.super__Deque_impl_data._M_start._M_first));
    }
    else {
      pbVar9 = local_1c38._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((byte *)0x1ff < pbVar6) {
        uVar5 = (ulong)pbVar6 >> 9;
        goto LAB_00103cd4;
      }
    }
    local_1c40 = CONCAT71(local_1c40._1_7_,pbVar9[lVar10]);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)&local_1c40,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"->",2);
    poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  goto LAB_00103d9b;
}

Assistant:

bool isItAFunction(uint L = 7) {
  mersenneRNG generator(5);
  const uint n(3); // n-grams
  hashfunction hf(n, L);
  deque<unsigned char> s;
  for (uint32 k = 0; k < n; ++k) {
    unsigned char c = static_cast<unsigned char>(generator() + 65);
    s.push_back(c);
    hf.eat(c);
  }
  for (uint32 k = 0; k < 100000; ++k) {
    unsigned char out = s.front();
    s.pop_front();
    char c(generator() + 65);

    s.push_back(c);
    hf.update(out, c);
    if (hf.hash(s) != hf.hashvalue) {
      for (deque<unsigned char>::iterator ii = s.begin(); ii != s.end(); ++ii)
        cout << *ii << " " << static_cast<uint32>(*ii) << endl;
      cerr << "bug" << endl;
      cerr << s[0] << s[1] << s[2] << " was hashed to " << hf.hashvalue
           << " when true hash value is " << hf.hash(s) << endl;
      for (uint j = 0; j < n; ++j)
        cerr << s[j] << "->" << hf.hasher.hashvalues[s[j]] << endl;
      return false;
    }
  }
  return true;
}